

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.h
# Opt level: O0

void * __thiscall
rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::Malloc
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *this,size_t size)

{
  ChunkHeader *pCVar1;
  bool bVar2;
  ulong uVar3;
  long in_RSI;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_RDI;
  void *buffer;
  size_t capacity;
  uint8_t *local_8;
  
  if (in_RSI == 0) {
    local_8 = (uint8_t *)0x0;
  }
  else {
    uVar3 = in_RSI + 7U & 0xfffffffffffffff8;
    if (in_RDI->shared_->chunkHead->capacity < in_RDI->shared_->chunkHead->size + uVar3) {
      capacity = uVar3;
      if (uVar3 < in_RDI->chunk_capacity_) {
        capacity = in_RDI->chunk_capacity_;
      }
      bVar2 = AddChunk(in_RDI,capacity);
      if (!bVar2) {
        return (void *)0x0;
      }
    }
    local_8 = GetChunkBuffer(in_RDI->shared_);
    local_8 = local_8 + in_RDI->shared_->chunkHead->size;
    pCVar1 = in_RDI->shared_->chunkHead;
    pCVar1->size = uVar3 + pCVar1->size;
  }
  return local_8;
}

Assistant:

void* Malloc(size_t size) {
        RAPIDJSON_NOEXCEPT_ASSERT(shared_->refcount > 0);
        if (!size)
            return NULL;

        size = RAPIDJSON_ALIGN(size);
        if (RAPIDJSON_UNLIKELY(shared_->chunkHead->size + size > shared_->chunkHead->capacity))
            if (!AddChunk(chunk_capacity_ > size ? chunk_capacity_ : size))
                return NULL;

        void *buffer = GetChunkBuffer(shared_) + shared_->chunkHead->size;
        shared_->chunkHead->size += size;
        return buffer;
    }